

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

int __thiscall
google::protobuf::internal::EpsCopyInputStream::PushLimit
          (EpsCopyInputStream *this,char *ptr,int limit)

{
  int iVar1;
  LogMessage *other;
  uint uVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (0x7fffffef < (uint)limit) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
               ,0x81);
    other = LogMessage::operator<<
                      (&local_58,"CHECK failed: limit >= 0 && limit <= INT_MAX - kSlopBytes: ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  uVar2 = ((int)ptr - (int)this->buffer_end_) + limit;
  this->limit_end_ = this->buffer_end_ + (int)((int)uVar2 >> 0x1f & uVar2);
  iVar1 = this->limit_;
  this->limit_ = uVar2;
  return iVar1 - uVar2;
}

Assistant:

PROTOBUF_NODISCARD int PushLimit(const char* ptr, int limit) {
    GOOGLE_DCHECK(limit >= 0 && limit <= INT_MAX - kSlopBytes);
    // This add is safe due to the invariant above, because
    // ptr - buffer_end_ <= kSlopBytes.
    limit += static_cast<int>(ptr - buffer_end_);
    limit_end_ = buffer_end_ + (std::min)(0, limit);
    auto old_limit = limit_;
    limit_ = limit;
    return old_limit - limit;
  }